

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&)>
::_call<0,1,2>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               *__return_storage_ptr__,void *this,vector *args,sequence<0,_1,_2> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  numeric *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __args = try_convert_and_check<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  __args_1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
             convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
  ::operator()(&local_40,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
                *)this,__args,__args_1,
               (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start + 2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == &local_40.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_40._M_string_length;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}